

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

bool tinyusdz::value::UpcastType(string *reqType,Value *inout)

{
  undefined6 uVar1;
  storage_t<unsigned_int> sVar2;
  long lVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  bool bVar8;
  float dst;
  optional<std::array<tinyusdz::value::half,_4UL>_> local_5a;
  undefined1 local_50 [4];
  storage_t<unsigned_int> sStack_4c;
  undefined8 local_48;
  double local_40;
  double local_38;
  
  TryGetUnderlyingTypeId((optional<unsigned_int> *)local_50,reqType);
  if (local_50[0] == (string)0x1) {
    sVar2 = sStack_4c;
    _local_50 = (optional<unsigned_int>)&local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"[]","");
    if (reqType->_M_string_length < (ulong)local_48) {
      bVar8 = false;
    }
    else {
      lVar3 = std::__cxx11::string::find
                        ((char *)reqType,(ulong)_local_50,reqType->_M_string_length - (long)local_48
                        );
      bVar8 = lVar3 != -1;
    }
    if (_local_50 != (optional<unsigned_int>)&local_40) {
      operator_delete((void *)_local_50,(long)local_40 + 1);
    }
    if (!bVar8) {
      switch(sVar2) {
      case (storage_t<unsigned_int>)0x28:
        Value::get_value<tinyusdz::value::half>
                  ((optional<tinyusdz::value::half> *)&local_5a,inout,false);
        if (local_5a.has_value_ == true) {
          uVar4 = (uint)(ushort)local_5a.contained.data._0_2_ << 0xd;
          if ((uVar4 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar4 | 0x70000000);
          }
          else if ((uVar4 & 0xf800000) == 0) {
            fVar5 = (float)(uVar4 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar4 & 0xfffe000) + 0x38000000);
          }
          local_50 = (undefined1  [4])
                     ((int)(short)local_5a.contained.data._0_2_ & 0x80000000U | (uint)fVar5);
          linb::any::operator=(&inout->v_,(float *)local_50);
          return true;
        }
        break;
      case (storage_t<unsigned_int>)0x29:
        Value::get_value<std::array<tinyusdz::value::half,2ul>>
                  ((optional<std::array<tinyusdz::value::half,_2UL>_> *)local_50,inout,false);
        if (local_50[0] == (string)0x1) {
          uVar4 = (int)stack0xffffffffffffffb2 << 0xd;
          if ((uVar4 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar4 & 0x1fffe000 | 0x70000000);
          }
          else if ((uVar4 & 0xf800000) == 0) {
            fVar5 = (float)(uVar4 & 0x1fffe000 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar4 & 0xfffe000) + 0x38000000);
          }
          uVar4 = (uint)stack0xffffffffffffffb2 & 0x8000;
          uVar7 = (uint)stack0xffffffffffffffb2 >> 3;
          if ((uVar7 & 0xf800000) == 0xf800000) {
            fVar6 = (float)(uVar7 & 0x1fffe000 | 0x70000000);
          }
          else if ((uVar7 & 0xf800000) == 0) {
            fVar6 = (float)(uVar7 & 0x1fffe000 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar6 = (float)((uVar7 & 0xfffe000) + 0x38000000);
          }
          sStack_4c = (storage_t<unsigned_int>)
                      ((uint)stack0xffffffffffffffb2 & 0x80000000 | (uint)fVar6);
          local_50 = (undefined1  [4])(uVar4 << 0x10 | (uint)fVar5);
          linb::any::operator=(&inout->v_,(array<float,_2UL> *)local_50);
          return true;
        }
        return false;
      case (storage_t<unsigned_int>)0x2a:
        Value::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&local_5a,inout,false);
        if (local_5a.has_value_ == true) {
          uVar4 = (uint)(ushort)local_5a.contained.data._0_2_ << 0xd;
          if ((uVar4 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar4 | 0x70000000);
          }
          else if ((uVar4 & 0xf800000) == 0) {
            fVar5 = (float)(uVar4 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar4 & 0xfffe000) + 0x38000000);
          }
          uVar4 = (uint)(ushort)local_5a.contained._2_2_ << 0xd;
          if ((uVar4 & 0xf800000) == 0xf800000) {
            fVar6 = (float)(uVar4 | 0x70000000);
          }
          else if ((uVar4 & 0xf800000) == 0) {
            fVar6 = (float)(uVar4 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar6 = (float)((uVar4 & 0xfffe000) + 0x38000000);
          }
          sStack_4c = (storage_t<unsigned_int>)
                      ((int)(short)local_5a.contained._2_2_ & 0x80000000U | (uint)fVar6);
          local_50 = (undefined1  [4])
                     ((int)(short)local_5a.contained.data._0_2_ & 0x80000000U | (uint)fVar5);
          uVar4 = (uint)(ushort)local_5a.contained._4_2_ << 0xd;
          if ((uVar4 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar4 | 0x70000000);
          }
          else if ((uVar4 & 0xf800000) == 0) {
            fVar5 = (float)(uVar4 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar4 & 0xfffe000) + 0x38000000);
          }
          local_48 = (double)CONCAT44(local_48._4_4_,
                                      (int)(short)local_5a.contained._4_2_ & 0x80000000U |
                                      (uint)fVar5);
          linb::any::operator=(&inout->v_,(array<float,_3UL> *)local_50);
          return true;
        }
        break;
      case (storage_t<unsigned_int>)0x2b:
        Value::get_value<std::array<tinyusdz::value::half,4ul>>(&local_5a,inout,false);
        if (local_5a.has_value_ == true) {
          uVar1 = CONCAT24(local_5a.contained._4_2_,
                           CONCAT22(local_5a.contained._2_2_,local_5a.contained.data.__align));
          if (((ushort)local_5a.contained.data._0_2_ & 0x7c00) == 0x7c00) {
            fVar5 = (float)((uint)(ushort)local_5a.contained.data._0_2_ << 0xd | 0x70000000);
          }
          else if (((ushort)local_5a.contained.data._0_2_ & 0x7c00) == 0) {
            fVar5 = (float)((uint)(ushort)local_5a.contained.data._0_2_ << 0xd | 0x38800000) +
                    -6.1035156e-05;
          }
          else {
            fVar5 = (float)(((ushort)local_5a.contained.data._0_2_ & 0x7fff) * 0x2000 + 0x38000000);
          }
          uVar4 = (uint)((uint6)uVar1 >> 0x10);
          uVar7 = uVar4 << 0xd;
          if ((uVar7 & 0xf800000) == 0xf800000) {
            fVar6 = (float)(uVar7 & 0x1fffe000 | 0x70000000);
          }
          else if ((uVar7 & 0xf800000) == 0) {
            fVar6 = (float)(uVar7 & 0x1fffe000 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar6 = (float)((uVar7 & 0xfffe000) + 0x38000000);
          }
          sStack_4c = (storage_t<unsigned_int>)((uVar4 & 0x8000) << 0x10 | (uint)fVar6);
          local_50 = (undefined1  [4])
                     (((ushort)local_5a.contained.data._0_2_ & 0x8000) << 0x10 | (uint)fVar5);
          uVar4 = (uint)(CONCAT26(local_5a.contained._6_2_,uVar1) >> 0x20);
          uVar7 = uVar4 << 0xd;
          if ((uVar7 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar7 & 0x1fffe000 | 0x70000000);
          }
          else if ((uVar7 & 0xf800000) == 0) {
            fVar5 = (float)(uVar7 & 0x1fffe000 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar7 & 0xfffe000) + 0x38000000);
          }
          uVar7 = (uint)(ushort)local_5a.contained._6_2_ << 0xd;
          if ((uVar7 & 0xf800000) == 0xf800000) {
            fVar6 = (float)(uVar7 | 0x70000000);
          }
          else if ((uVar7 & 0xf800000) == 0) {
            fVar6 = (float)(uVar7 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar6 = (float)((uVar7 & 0xfffe000) + 0x38000000);
          }
          local_48 = (double)CONCAT44(((ushort)local_5a.contained._6_2_ & 0x8000) << 0x10 |
                                      (uint)fVar6,(uVar4 & 0x8000) << 0x10 | (uint)fVar5);
          linb::any::operator=(&inout->v_,(array<float,_4UL> *)local_50);
          return true;
        }
        break;
      case (storage_t<unsigned_int>)0x2c:
        Value::get_value<tinyusdz::value::half>
                  ((optional<tinyusdz::value::half> *)&local_5a,inout,false);
        if (local_5a.has_value_ == true) {
          uVar4 = (uint)(ushort)local_5a.contained.data._0_2_ << 0xd;
          if ((uVar4 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar4 | 0x70000000);
          }
          else if ((uVar4 & 0xf800000) == 0) {
            fVar5 = (float)(uVar4 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar4 & 0xfffe000) + 0x38000000);
          }
          _local_50 = (optional<unsigned_int>)
                      (double)(float)((int)(short)local_5a.contained.data._0_2_ & 0x80000000U |
                                     (uint)fVar5);
          linb::any::operator=(&inout->v_,(double *)local_50);
          return true;
        }
        break;
      case (storage_t<unsigned_int>)0x2d:
        Value::get_value<std::array<tinyusdz::value::half,2ul>>
                  ((optional<std::array<tinyusdz::value::half,_2UL>_> *)&local_5a,inout,false);
        if (local_5a.has_value_ == true) {
          if (((ushort)local_5a.contained.data._0_2_ & 0x7c00) == 0x7c00) {
            fVar5 = (float)((uint)(ushort)local_5a.contained.data._0_2_ << 0xd | 0x70000000);
          }
          else if (((ushort)local_5a.contained.data._0_2_ & 0x7c00) == 0) {
            fVar5 = (float)((uint)(ushort)local_5a.contained.data._0_2_ << 0xd | 0x38800000) +
                    -6.1035156e-05;
          }
          else {
            fVar5 = (float)(((ushort)local_5a.contained.data._0_2_ & 0x7fff) * 0x2000 + 0x38000000);
          }
          _local_50 = (optional<unsigned_int>)
                      (double)(float)(((ushort)local_5a.contained.data._0_2_ & 0x8000) << 0x10 |
                                     (uint)fVar5);
          uVar4 = ((uint)(ushort)local_5a.contained._2_2_ << 0x10) >> 3;
          if ((local_5a.contained._2_2_ & 0x7c00) == 0x7c00) {
            fVar5 = (float)(uVar4 | 0x70000000);
          }
          else if ((local_5a.contained._2_2_ & 0x7c00) == 0) {
            fVar5 = (float)(uVar4 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)(((((ushort)local_5a.contained._2_2_ & 0x7fff) << 0x10) >> 3) +
                           0x38000000);
          }
          local_48 = (double)(float)(((ushort)local_5a.contained._2_2_ & 0x8000) << 0x10 |
                                    (uint)fVar5);
          linb::any::operator=(&inout->v_,(array<double,_2UL> *)local_50);
          return true;
        }
        break;
      case (storage_t<unsigned_int>)0x2e:
        Value::get_value<std::array<tinyusdz::value::half,3ul>>
                  ((optional<std::array<tinyusdz::value::half,_3UL>_> *)&local_5a,inout,false);
        if (local_5a.has_value_ == true) {
          uVar4 = (uint)(ushort)local_5a.contained.data._0_2_ << 0xd;
          if ((uVar4 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar4 | 0x70000000);
          }
          else if ((uVar4 & 0xf800000) == 0) {
            fVar5 = (float)(uVar4 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar4 & 0xfffe000) + 0x38000000);
          }
          _local_50 = (optional<unsigned_int>)
                      (double)(float)((int)(short)local_5a.contained.data._0_2_ & 0x80000000U |
                                     (uint)fVar5);
          uVar4 = (uint)(ushort)local_5a.contained._2_2_ << 0xd;
          if ((uVar4 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar4 | 0x70000000);
          }
          else if ((uVar4 & 0xf800000) == 0) {
            fVar5 = (float)(uVar4 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar4 & 0xfffe000) + 0x38000000);
          }
          local_48 = (double)(float)((int)(short)local_5a.contained._2_2_ & 0x80000000U |
                                    (uint)fVar5);
          uVar4 = (uint)(ushort)local_5a.contained._4_2_ << 0xd;
          if ((uVar4 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar4 | 0x70000000);
          }
          else if ((uVar4 & 0xf800000) == 0) {
            fVar5 = (float)(uVar4 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar4 & 0xfffe000) + 0x38000000);
          }
          local_40 = (double)(float)((int)(short)local_5a.contained._4_2_ & 0x80000000U |
                                    (uint)fVar5);
          linb::any::operator=(&inout->v_,(array<double,_3UL> *)local_50);
          return true;
        }
        break;
      case (storage_t<unsigned_int>)0x2f:
        Value::get_value<std::array<tinyusdz::value::half,4ul>>(&local_5a,inout,false);
        if (local_5a.has_value_ == true) {
          uVar1 = CONCAT24(local_5a.contained._4_2_,
                           CONCAT22(local_5a.contained._2_2_,local_5a.contained.data.__align));
          if (((ushort)local_5a.contained.data._0_2_ & 0x7c00) == 0x7c00) {
            fVar5 = (float)((uint)(ushort)local_5a.contained.data._0_2_ << 0xd | 0x70000000);
          }
          else if (((ushort)local_5a.contained.data._0_2_ & 0x7c00) == 0) {
            fVar5 = (float)((uint)(ushort)local_5a.contained.data._0_2_ << 0xd | 0x38800000) +
                    -6.1035156e-05;
          }
          else {
            fVar5 = (float)(((ushort)local_5a.contained.data._0_2_ & 0x7fff) * 0x2000 + 0x38000000);
          }
          _local_50 = (optional<unsigned_int>)
                      (double)(float)(((ushort)local_5a.contained.data._0_2_ & 0x8000) << 0x10 |
                                     (uint)fVar5);
          uVar4 = (uint)((uint6)uVar1 >> 0x10);
          uVar7 = uVar4 << 0xd;
          if ((uVar7 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar7 & 0x1fffe000 | 0x70000000);
          }
          else if ((uVar7 & 0xf800000) == 0) {
            fVar5 = (float)(uVar7 & 0x1fffe000 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar7 & 0xfffe000) + 0x38000000);
          }
          local_48 = (double)(float)((uVar4 & 0x8000) << 0x10 | (uint)fVar5);
          uVar4 = (uint)(CONCAT26(local_5a.contained._6_2_,uVar1) >> 0x20);
          uVar7 = uVar4 << 0xd;
          if ((uVar7 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar7 & 0x1fffe000 | 0x70000000);
          }
          else if ((uVar7 & 0xf800000) == 0) {
            fVar5 = (float)(uVar7 & 0x1fffe000 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar7 & 0xfffe000) + 0x38000000);
          }
          local_40 = (double)(float)((uVar4 & 0x8000) << 0x10 | (uint)fVar5);
          uVar4 = (uint)(ushort)local_5a.contained._6_2_ << 0xd;
          if ((uVar4 & 0xf800000) == 0xf800000) {
            fVar5 = (float)(uVar4 | 0x70000000);
          }
          else if ((uVar4 & 0xf800000) == 0) {
            fVar5 = (float)(uVar4 | 0x38800000) + -6.1035156e-05;
          }
          else {
            fVar5 = (float)((uVar4 & 0xfffe000) + 0x38000000);
          }
          local_38 = (double)(float)(((ushort)local_5a.contained._6_2_ & 0x8000) << 0x10 |
                                    (uint)fVar5);
          linb::any::operator=(&inout->v_,(array<double,_4UL> *)local_50);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool UpcastType(const std::string &reqType, value::Value &inout) {
  // `reqType` may be Role type. Get underlying type
  uint32_t tyid;
  if (auto pv = value::TryGetUnderlyingTypeId(reqType)) {
    tyid = pv.value();
  } else {
    // Invalid reqType.
    return false;
  }

  bool reqTypeArray = false;
  //uint32_t baseReqTyId;
  DCOUT("UpcastType trial: reqTy : " << reqType
                                     << ", valtype = " << inout.type_name());

  if (endsWith(reqType, "[]")) {
    reqTypeArray = true;
    //baseReqTyId = value::GetTypeId(removeSuffix(reqType, "[]"));
  } else {
    //baseReqTyId = value::GetTypeId(reqType);
  }
  DCOUT("is array: " << reqTypeArray);

  // For array
  if (reqTypeArray) {
    // TODO
  } else {
    if (tyid == value::TYPE_ID_FLOAT) {
      float dst;
      if (auto pv = inout.get_value<value::half>()) {
        dst = half_to_float(pv.value());
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_FLOAT2) {
      if (auto pv = inout.get_value<value::half2>()) {
        value::float2 dst;
        value::half2 v = pv.value();
        dst[0] = half_to_float(v[0]);
        dst[1] = half_to_float(v[1]);
        inout = dst;
        return true;
      }

    } else if (tyid == value::TYPE_ID_FLOAT3) {
      value::float3 dst;
      if (auto pv = inout.get_value<value::half3>()) {
        value::half3 v = pv.value();
        dst[0] = half_to_float(v[0]);
        dst[1] = half_to_float(v[1]);
        dst[2] = half_to_float(v[2]);
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_FLOAT4) {
      value::float4 dst;
      if (auto pv = inout.get_value<value::half4>()) {
        value::half4 v = pv.value();
        dst[0] = half_to_float(v[0]);
        dst[1] = half_to_float(v[1]);
        dst[2] = half_to_float(v[2]);
        dst[3] = half_to_float(v[3]);
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE) {
      double dst;
      if (auto pv = inout.get_value<value::half>()) {
        dst = double(half_to_float(pv.value()));
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE2) {
      value::double2 dst;
      if (auto pv = inout.get_value<value::half2>()) {
        value::half2 v = pv.value();
        dst[0] = double(half_to_float(v[0]));
        dst[1] = double(half_to_float(v[1]));
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE3) {
      value::double3 dst;
      if (auto pv = inout.get_value<value::half3>()) {
        value::half3 v = pv.value();
        dst[0] = double(half_to_float(v[0]));
        dst[1] = double(half_to_float(v[1]));
        dst[2] = double(half_to_float(v[2]));
        inout = dst;
        return true;
      }
    } else if (tyid == value::TYPE_ID_DOUBLE4) {
      value::double4 dst;
      if (auto pv = inout.get_value<value::half4>()) {
        value::half4 v = pv.value();
        dst[0] = double(half_to_float(v[0]));
        dst[1] = double(half_to_float(v[1]));
        dst[2] = double(half_to_float(v[2]));
        dst[3] = double(half_to_float(v[3]));
        inout = dst;
        return true;
      }
    }
  }

  return false;
}